

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2max_distance_targets.cc
# Opt level: O0

bool __thiscall
S2MaxDistanceCellTarget::UpdateMinDistance
          (S2MaxDistanceCellTarget *this,S2Point *v0,S2Point *v1,S2MaxDistance *min_dist)

{
  bool bVar1;
  S1ChordAngle x;
  S2MaxDistance local_30;
  S2MaxDistance *local_28;
  S2MaxDistance *min_dist_local;
  S2Point *v1_local;
  S2Point *v0_local;
  S2MaxDistanceCellTarget *this_local;
  
  local_28 = min_dist;
  min_dist_local = (S2MaxDistance *)v1;
  v1_local = v0;
  v0_local = (S2Point *)this;
  x = S2Cell::GetMaxDistance(&this->cell_,v0,v1);
  S2MaxDistance::S2MaxDistance(&local_30,x);
  bVar1 = S2MaxDistance::UpdateMin(min_dist,&local_30);
  return bVar1;
}

Assistant:

bool S2MaxDistanceCellTarget::UpdateMinDistance(
    const S2Point& v0, const S2Point& v1, S2MaxDistance* min_dist) {
  return min_dist->UpdateMin(S2MaxDistance(cell_.GetMaxDistance(v0, v1)));
}